

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

int AF_DObject_C_MidPrint
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  FFont *font_00;
  char *pcVar2;
  FString text;
  FString font;
  FString local_28;
  FString local_20;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x02') {
      FString::AttachToOther(&local_20,(FString *)param);
      if (numparam == 1) {
        pcVar2 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x02') {
          FString::AttachToOther(&local_28,(FString *)(param + 1));
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_00354371;
            pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_00354371:
              iVar1 = param[2].field_0.i;
              font_00 = FFont::FindFont(local_20.Chars);
              if (*local_28.Chars == '$') {
                local_28.Chars = FStringTable::operator()(&GStrings,local_28.Chars + 1);
              }
              if (iVar1 == 0) {
                C_MidPrint(font_00,local_28.Chars);
              }
              else {
                C_MidPrintBold(font_00,local_28.Chars);
              }
              FString::~FString(&local_28);
              FString::~FString(&local_20);
              return 0;
            }
            pcVar2 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                        ,0x6d6,
                        "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar2 = "param[paramnum].Type == REGT_STRING";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                    ,0x6d5,
                    "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pcVar2 = "param[paramnum].Type == REGT_STRING";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                ,0x6d4,
                "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, C_MidPrint)
{
	PARAM_PROLOGUE;
	PARAM_STRING(font);
	PARAM_STRING(text);
	PARAM_BOOL_DEF(bold);

	FFont *fnt = FFont::FindFont(font);
	const char *txt = text[0] == '$'? GStrings(&text[1]) : text.GetChars();
	if (!bold) C_MidPrint(fnt, txt);
	else C_MidPrintBold(fnt, txt);
	return 0;
}